

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O0

void __thiscall
duckdb::ColumnReader::
PlainTemplatedInternal<duckdb::interval_t,duckdb::IntervalValueConversion,false,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  interval_t *piVar1;
  interval_t *piVar2;
  long in_RCX;
  ByteBuffer *in_RDI;
  ulong in_R8;
  interval_t iVar3;
  idx_t row_idx;
  ValidityMask *result_mask;
  interval_t *result_ptr;
  ColumnReader *in_stack_ffffffffffffff98;
  undefined8 local_58;
  int64_t local_50;
  ulong local_48;
  
  piVar1 = FlatVector::GetData<duckdb::interval_t>((Vector *)0x59e1d6);
  FlatVector::Validity((Vector *)0x59e1e5);
  for (local_48 = in_R8; local_48 < in_R8 + in_RCX; local_48 = local_48 + 1) {
    iVar3 = IntervalValueConversion::PlainRead<true>(in_RDI,in_stack_ffffffffffffff98);
    piVar2 = piVar1 + local_48;
    local_58 = iVar3._0_8_;
    piVar2->months = (undefined4)local_58;
    piVar2->days = local_58._4_4_;
    local_50 = iVar3.micros;
    piVar2->micros = local_50;
  }
  return;
}

Assistant:

void PlainTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines, const uint64_t num_values,
	                            const idx_t result_offset, Vector &result) {
		const auto result_ptr = FlatVector::GetData<VALUE_TYPE>(result);
		if (!HAS_DEFINES && !CHECKED && CONVERSION::PlainConstantSize() == sizeof(VALUE_TYPE)) {
			// we can memcpy
			idx_t copy_count = num_values * CONVERSION::PlainConstantSize();
			memcpy(result_ptr + result_offset, plain_data.ptr, copy_count);
			plain_data.unsafe_inc(copy_count);
			return;
		}
		auto &result_mask = FlatVector::Validity(result);
		for (idx_t row_idx = result_offset; row_idx < result_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				result_mask.SetInvalid(row_idx);
				continue;
			}
			result_ptr[row_idx] = CONVERSION::template PlainRead<CHECKED>(plain_data, *this);
		}
	}